

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

DVector2 FindRefPoint(line_t *ld,DVector2 *pos)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  sector_t *psVar5;
  sector_t *psVar6;
  undefined1 auVar7 [16];
  double *in_RDI;
  double dVar8;
  double dVar9;
  DVector2 DVar10;
  
  psVar5 = ld->frontsector;
  dVar1 = (psVar5->floorplane).normal.X;
  if ((((dVar1 == 0.0) && (!NAN(dVar1))) && (dVar1 = (psVar5->floorplane).normal.Y, dVar1 == 0.0))
     && (!NAN(dVar1))) {
    psVar6 = ld->backsector;
    dVar1 = (psVar6->floorplane).normal.X;
    if ((((((dVar1 == 0.0) && (!NAN(dVar1))) &&
          ((dVar1 = (psVar6->floorplane).normal.Y, dVar1 == 0.0 &&
           ((!NAN(dVar1) && (dVar1 = (psVar5->ceilingplane).normal.X, dVar1 == 0.0)))))) &&
         (!NAN(dVar1))) &&
        ((((dVar1 = (psVar5->ceilingplane).normal.Y, dVar1 == 0.0 && (!NAN(dVar1))) &&
          (dVar1 = (psVar6->ceilingplane).normal.X, dVar1 == 0.0)) &&
         ((!NAN(dVar1) && (dVar1 = (psVar6->ceilingplane).normal.Y, dVar1 == 0.0)))))) &&
       (((!NAN(dVar1) &&
         (((psVar6->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count == 0 &&
          ((psVar5->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count == 0)))) &&
        (((psVar5->planes[1].Flags & 0x1d0U) != 0x100 &&
         ((psVar5->planes[0].Flags & 0x1d0U) != 0x100)))))) {
      *in_RDI = pos->X;
      dVar1 = pos->Y;
      in_RDI[1] = dVar1;
      DVar10.Y = 0.0;
      DVar10.X = dVar1;
      return DVar10;
    }
  }
  dVar1 = (ld->v1->p).X;
  dVar2 = (ld->v1->p).Y;
  dVar3 = (ld->delta).X;
  dVar4 = (ld->delta).Y;
  dVar8 = ((pos->Y - dVar2) * dVar4 + (pos->X - dVar1) * dVar3) / (dVar4 * dVar4 + dVar3 * dVar3);
  dVar9 = 1.0;
  if (dVar8 <= 1.0) {
    dVar9 = dVar8;
  }
  dVar9 = (double)(-(ulong)(0.0 < dVar8) & (ulong)dVar9);
  *in_RDI = dVar3 * dVar9 + dVar1;
  in_RDI[1] = dVar9 * dVar4 + dVar2;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar2;
  return (DVector2)(auVar7 << 0x40);
}

Assistant:

static DVector2 FindRefPoint(line_t *ld, const DVector2 &pos)
{
	// If there's any chance of slopes getting in the way we need to get a proper refpoint, otherwise we can save the work.
	// Slopes can get in here when:
	// - the actual sector planes are sloped
	// - there's 3D floors in this sector
	// - there's a crossable floor portal (for which the dropoff needs to be calculated within P_LineOpening, and the lower sector can easily have slopes)
	//
	// Todo: check if this bootload of checks even helps or if it adds more than it saves
	//
	if 	(ld->frontsector->floorplane.isSlope() ||
			ld->backsector->floorplane.isSlope() ||
			ld->frontsector->ceilingplane.isSlope() ||
			ld->backsector->ceilingplane. isSlope() ||
			ld->backsector->e->XFloor.ffloors.Size() != 0 ||
			ld->frontsector->e->XFloor.ffloors.Size() != 0 ||
			!ld->frontsector->PortalBlocksMovement(sector_t::ceiling) ||
			!ld->frontsector->PortalBlocksMovement(sector_t::floor))
	{

		DVector2 v1 = ld->v1->fPos();
		DVector2 d = ld->Delta();
		double r = clamp(((pos.X - v1.X) * d.X + (pos.Y - v1.Y) * d.Y) / (d.X*d.X + d.Y*d.Y), 0., 1.);
		return v1 + d*r;
	}
	return pos;
}